

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

void __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::FileManager
          (FileManager<sjtu::TrainManager::stationNameType> *this,string *filepath,uint cache_size)

{
  pointer pcVar1;
  long *local_50 [2];
  long local_40 [2];
  
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base =
       (_func_int **)&PTR___cxa_pure_virtual_00123c20;
  std::fstream::fstream(&(this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).file);
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base =
       (_func_int **)&PTR_init_00123bb8;
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache =
       (LRUCache<sjtu::TrainManager::stationNameType> *)0x0;
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + filepath->_M_string_length);
  (**(this->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base)
            (this,local_50,(ulong)cache_size,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

FileManager(std::string filepath , unsigned int cache_size) {cache = nullptr , init(filepath , cache_size);}